

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

ON_TextureCoordinates * __thiscall
ON_Mesh::SetCachedTextureCoordinatesEx
          (ON_Mesh *this,ON_TextureMapping *mapping,ON_Xform *mesh_xform,bool bLazy,bool bSeamCheck)

{
  int iVar1;
  uint uVar2;
  ON_TextureCoordinates *pOVar3;
  byte bVar4;
  long lVar5;
  bool bVar6;
  ON_UUID *b;
  long lVar7;
  ulong uVar8;
  ON_Xform *pOVar9;
  ON_Xform *pOVar10;
  int *Tsd_00;
  long lVar11;
  ON_TextureCoordinates *tag;
  ON_3fPoint *p;
  byte bVar12;
  ON_SimpleArray<int> *Tsd;
  double two_pi_tc;
  ON_SimpleArray<int> Tside;
  ON_3dPoint T;
  ON_3dPoint local_278;
  ON_TextureMapping mp;
  
  bVar12 = 0;
  bVar6 = ON_TextureMapping::RequiresVertexNormals(mapping);
  if ((bVar6) && (bVar6 = HasVertexNormals(this), !bVar6)) {
    ComputeVertexNormals(this);
  }
  ON_TextureMapping::ON_TextureMapping(&mp,mapping);
  two_pi_tc = 1.0;
  Tside._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081add8;
  Tside.m_a = (int *)0x0;
  Tside.m_count = 0;
  Tside.m_capacity = 0;
  Tsd = (ON_SimpleArray<int> *)0x0;
  if (((bSeamCheck) && (bVar6 = SeamCheckHelper(&mp,&two_pi_tc,&Tside,&Tsd), bVar6)) &&
     (bVar6 = HasSharedVertices(this), bVar6)) {
    pOVar9 = &ON_Xform::IdentityTransformation;
    pOVar10 = &mp.m_uvw;
    for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
      pOVar10->m_xform[0][0] = pOVar9->m_xform[0][0];
      pOVar9 = (ON_Xform *)((long)pOVar9 + ((ulong)bVar12 * -2 + 1) * 8);
      pOVar10 = (ON_Xform *)((long)pOVar10 + (ulong)bVar12 * -0x10 + 8);
    }
    bVar4 = 1;
  }
  else {
    bVar4 = 0;
  }
  lVar7 = -1;
  lVar5 = -0xb8;
  do {
    lVar11 = lVar5;
    lVar7 = lVar7 + 1;
    if ((this->m_TC).m_count <= lVar7) goto LAB_004f72b4;
    pOVar3 = (this->m_TC).m_a;
    b = ON_ModelComponent::Id(&mapping->super_ON_ModelComponent);
    bVar6 = ::operator==((ON_UUID_struct *)(pOVar3[1].m_tag.m_mapping_id.Data4 + lVar11 + -8),b);
    lVar5 = lVar11 + 0xb8;
  } while (!bVar6);
  pOVar3 = (this->m_TC).m_a;
  tag = (ON_TextureCoordinates *)(pOVar3[1].m_tag.m_mapping_id.Data4 + lVar11 + -8);
  if (bLazy && pOVar3 != (ON_TextureCoordinates *)0x0) {
    bVar6 = ON_TextureMapping::HasMatchingTextureCoordinates
                      (mapping,(ON_MappingTag *)tag,mesh_xform);
    if (bVar6) goto LAB_004f73c4;
  }
  else if (pOVar3 == (ON_TextureCoordinates *)0x0) {
LAB_004f72b4:
    ON_ClassArray<ON_TextureCoordinates>::AppendNew(&this->m_TC);
    lVar7 = (long)(this->m_TC).m_count;
    tag = (ON_TextureCoordinates *)0x0;
    if (0 < lVar7) {
      tag = (this->m_TC).m_a + lVar7 + -1;
    }
  }
  bVar6 = ON_TextureMapping::GetTextureCoordinates(&mp,this,&tag->m_T,mesh_xform,false,Tsd);
  if (bVar6) {
    ON_MappingTag::Set(&tag->m_tag,mapping);
    if (((mesh_xform != (ON_Xform *)0x0) && (bVar6 = ON_Xform::IsValid(mesh_xform), bVar6)) &&
       ((bVar6 = ON_Xform::IsIdentity(mesh_xform,0.0), !bVar6 &&
        (bVar6 = ON_Xform::IsZero(mesh_xform), !bVar6)))) {
      pOVar9 = mesh_xform;
      pOVar10 = &(tag->m_tag).m_mesh_xform;
      for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
        pOVar10->m_xform[0][0] = pOVar9->m_xform[0][0];
        pOVar9 = (ON_Xform *)((long)pOVar9 + ((ulong)bVar12 * -2 + 1) * 8);
        pOVar10 = (ON_Xform *)((long)pOVar10 + (ulong)bVar12 * -0x10 + 8);
      }
    }
    tag->m_dim = 2;
    if (((bool)(bVar4 & 0 < (this->m_F).m_count)) &&
       (iVar1 = (tag->m_T).m_count, iVar1 == (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count))
    {
      Tsd_00 = Tside.m_a;
      if (Tside.m_count != iVar1) {
        Tsd_00 = (int *)0x0;
      }
      if (Tsd == (ON_SimpleArray<int> *)0x0) {
        Tsd_00 = (int *)0x0;
      }
      AdjustMeshPeriodicTextureCoordinatesHelper
                (this,mesh_xform,&((tag->m_T).m_a)->x,3,Tsd_00,two_pi_tc,&mp);
      pOVar9 = &mapping->m_uvw;
      bVar6 = ON_Xform::IsIdentity(pOVar9,0.0);
      if ((!bVar6) && (bVar6 = ON_Xform::IsZero(pOVar9), !bVar6)) {
        uVar2 = (tag->m_T).m_count;
        p = (tag->m_T).m_a;
        uVar8 = 0;
        if (0 < (int)uVar2) {
          uVar8 = (ulong)uVar2;
        }
        while (bVar6 = uVar8 != 0, uVar8 = uVar8 - 1, bVar6) {
          ON_3dPoint::operator=(&T,p);
          ON_Xform::operator*(&local_278,pOVar9,&T);
          T.z = local_278.z;
          T.x = local_278.x;
          T.y = local_278.y;
          ON_3fPoint::operator=(p,&T);
          p = p + 1;
        }
      }
    }
  }
  else {
    ON_ClassArray<ON_TextureCoordinates>::Remove
              (&this->m_TC,(int)(((long)tag - (long)(this->m_TC).m_a) / 0xb8));
    tag = (ON_TextureCoordinates *)0x0;
  }
LAB_004f73c4:
  ON_SimpleArray<int>::~ON_SimpleArray(&Tside);
  ON_TextureMapping::~ON_TextureMapping(&mp);
  return tag;
}

Assistant:

const ON_TextureCoordinates* ON_Mesh::SetCachedTextureCoordinatesEx(
        const class ON_TextureMapping& mapping,
        const class ON_Xform* mesh_xform,
        bool bLazy,
        bool bSeamCheck
        )
{
  if ( mapping.RequiresVertexNormals() && !HasVertexNormals() )
    ComputeVertexNormals();

  ON_TextureMapping mp = mapping;
  double two_pi_tc = 1.0;
  ON_SimpleArray<int> Tside;
  ON_SimpleArray<int>* Tsd = 0;

  if (bSeamCheck)
  {
    bSeamCheck = SeamCheckHelper(mp, two_pi_tc, Tside, Tsd) && HasSharedVertices(*this);
    if (bSeamCheck)
      mp.m_uvw = ON_Xform::IdentityTransformation;
  }

  ON_TextureCoordinates* TC = 0;
  {
    for ( int i = 0; i < m_TC.Count(); i++ )
    {
      if ( m_TC[i].m_tag.m_mapping_id == mapping.Id() )
      {
        TC = &m_TC[i];
        break;
      }
    }
  }
  if ( bLazy && TC && mapping.HasMatchingTextureCoordinates( TC->m_tag, mesh_xform ) )
    return TC;

  if ( !TC )
  {
    m_TC.AppendNew();
    TC = m_TC.Last();
  }

  // Use mp instead of mapping to call GetTextureCoordinates()
  // because m_uvw must be the identity if we have seams.
  if ( !mp.GetTextureCoordinates( *this,TC->m_T,mesh_xform,false,Tsd) )
  {
    int tci = (int)(TC - m_TC.Array());
    m_TC.Remove(tci);
    return 0;
  }

  TC->m_tag.Set(mapping);
  if (    mesh_xform && mesh_xform->IsValid()
       && !mesh_xform->IsIdentity()
       && !mesh_xform->IsZero()
     )
  {
    TC->m_tag.m_mesh_xform = *mesh_xform;
  }

  TC->m_dim = 2;

  if ( bSeamCheck &&  m_F.Count() > 0 && TC->m_T.Count() == m_V.Count() )
  {
    float* mesh_T = (float*)TC->m_T.Array();
    int mesh_T_stride = sizeof(TC->m_T[0])/sizeof(mesh_T[0]);
    if ( Tsd && Tside.Count() != m_V.Count() )
      Tsd = 0;
    AdjustMeshPeriodicTextureCoordinatesHelper( *this, mesh_xform, mesh_T, mesh_T_stride, Tsd ? Tside.Array() : 0, two_pi_tc, mp );
    mesh_T = 0; // when the array is grown, the pointer may become invalid
    if ( !mapping.m_uvw.IsIdentity() && !mapping.m_uvw.IsZero() )
    {
      // Apply the uvw transformation that is on mapping
      // to the texture coordinates.
      ON_3dPoint T;
      int vi, vcnt = TC->m_T.Count();
      ON_3fPoint* meshT = TC->m_T.Array();
      for ( vi = 0; vi < vcnt; vi++ )
      {
        T = meshT[vi];
        T = mapping.m_uvw*T;
        meshT[vi] = T;
      }
    }
  }

  return TC;
}